

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_codec.c
# Opt level: O2

int frame_codec_unsubscribe(FRAME_CODEC_HANDLE frame_codec,uint8_t type)

{
  int iVar1;
  LIST_ITEM_HANDLE item_handle;
  void *__ptr;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  uint8_t type_local;
  
  type_local = type;
  if (frame_codec == (FRAME_CODEC_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x217;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x217;
    }
    pcVar4 = "NULL frame_codec";
    iVar3 = 0x216;
  }
  else {
    item_handle = singlylinkedlist_find
                            (frame_codec->subscription_list,find_subscription_by_frame_type,
                             &type_local);
    if (item_handle == (LIST_ITEM_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x223;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x223;
      }
      pcVar4 = "Cannot find subscription for type %u";
      iVar3 = 0x222;
    }
    else {
      __ptr = singlylinkedlist_item_get_value(item_handle);
      if (__ptr == (void *)0x0) {
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x22c;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0x22c;
        }
        pcVar4 = "singlylinkedlist_item_get_value failed when unsubscribing";
        iVar3 = 0x22b;
      }
      else {
        free(__ptr);
        iVar1 = singlylinkedlist_remove(frame_codec->subscription_list,item_handle);
        if (iVar1 == 0) {
          return 0;
        }
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x235;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0x235;
        }
        pcVar4 = "Cannot remove subscription from list";
        iVar3 = 0x234;
      }
    }
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/frame_codec.c"
            ,"frame_codec_unsubscribe",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int frame_codec_unsubscribe(FRAME_CODEC_HANDLE frame_codec, uint8_t type)
{
    int result;

    /* Codes_SRS_FRAME_CODEC_01_039: [If frame_codec is NULL, frame_codec_unsubscribe shall return a non-zero value.] */
    if (frame_codec == NULL)
    {
        LogError("NULL frame_codec");
        result = MU_FAILURE;
    }
    else
    {
        FRAME_CODEC_INSTANCE* frame_codec_data = (FRAME_CODEC_INSTANCE*)frame_codec;
        LIST_ITEM_HANDLE list_item = singlylinkedlist_find(frame_codec_data->subscription_list, find_subscription_by_frame_type, &type);

        if (list_item == NULL)
        {
            /* Codes_SRS_FRAME_CODEC_01_040: [If no subscription for the type frame type exists, frame_codec_unsubscribe shall return a non-zero value.] */
            /* Codes_SRS_FRAME_CODEC_01_041: [If any failure occurs while performing the unsubscribe operation, frame_codec_unsubscribe shall return a non-zero value.] */
            LogError("Cannot find subscription for type %u", (unsigned int)type);
            result = MU_FAILURE;
        }
        else
        {
            SUBSCRIPTION* subscription = (SUBSCRIPTION*)singlylinkedlist_item_get_value(list_item);
            if (subscription == NULL)
            {
                /* Codes_SRS_FRAME_CODEC_01_041: [If any failure occurs while performing the unsubscribe operation, frame_codec_unsubscribe shall return a non-zero value.] */
                LogError("singlylinkedlist_item_get_value failed when unsubscribing");
                result = MU_FAILURE;
            }
            else
            {
                free(subscription);
                if (singlylinkedlist_remove(frame_codec_data->subscription_list, list_item) != 0)
                {
                    /* Codes_SRS_FRAME_CODEC_01_041: [If any failure occurs while performing the unsubscribe operation, frame_codec_unsubscribe shall return a non-zero value.] */
                    LogError("Cannot remove subscription from list");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_FRAME_CODEC_01_038: [frame_codec_unsubscribe removes a previous subscription for frames of type type and on success it shall return 0.] */
                    result = 0;
                }
            }
        }
    }

    return result;
}